

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

bool __thiscall State::AddOut(State *this,Edge *edge,StringPiece path,uint64_t slash_bits)

{
  Edge *pEVar1;
  Node *local_40;
  Node *node;
  uint64_t slash_bits_local;
  Edge *edge_local;
  State *this_local;
  StringPiece path_local;
  
  path_local.str_ = (char *)path.len_;
  this_local = (State *)path.str_;
  node = (Node *)slash_bits;
  slash_bits_local = (uint64_t)edge;
  edge_local = (Edge *)this;
  local_40 = GetNode(this,path,slash_bits);
  pEVar1 = Node::in_edge(local_40);
  if (pEVar1 == (Edge *)0x0) {
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)(slash_bits_local + 0x28),&local_40);
    Node::set_in_edge(local_40,(Edge *)slash_bits_local);
  }
  return pEVar1 == (Edge *)0x0;
}

Assistant:

bool State::AddOut(Edge* edge, StringPiece path, uint64_t slash_bits) {
  Node* node = GetNode(path, slash_bits);
  if (node->in_edge())
    return false;
  edge->outputs_.push_back(node);
  node->set_in_edge(edge);
  return true;
}